

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_self_test(int verbose)

{
  uchar auVar1 [16];
  uchar auVar2 [16];
  uchar (*pauVar3) [16];
  uchar (*pauVar4) [48];
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uchar *__s2;
  size_t __n;
  uint uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t offset;
  uint local_214;
  ulong local_210;
  uchar iv [16];
  uchar buf [64];
  uchar prv [16];
  uchar key [32];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  uchar tmp [16];
  
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  key[8] = '\0';
  key[9] = '\0';
  key[10] = '\0';
  key[0xb] = '\0';
  key[0xc] = '\0';
  key[0xd] = '\0';
  key[0xe] = '\0';
  key[0xf] = '\0';
  key[0x10] = '\0';
  key[0x11] = '\0';
  key[0x12] = '\0';
  key[0x13] = '\0';
  key[0x14] = '\0';
  key[0x15] = '\0';
  key[0x16] = '\0';
  key[0x17] = '\0';
  key[0x18] = '\0';
  key[0x19] = '\0';
  key[0x1a] = '\0';
  key[0x1b] = '\0';
  key[0x1c] = '\0';
  key[0x1d] = '\0';
  key[0x1e] = '\0';
  key[0x1f] = '\0';
  memset(&ctx,0,0x120);
  for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
    uVar6 = uVar9 >> 1;
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar9 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)(uVar6 * 0x40 + 0x80),pcVar5);
    }
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar7 = uVar6 * 0x40 + 0x80;
    if ((uVar9 & 1) == 0) {
      mbedtls_aes_setkey_dec(&ctx,key,uVar7);
      iVar8 = 10000;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        mbedtls_aes_crypt_ecb(&ctx,0,buf,buf);
      }
      pauVar3 = aes_test_ecb_dec;
    }
    else {
      mbedtls_aes_setkey_enc(&ctx,key,uVar7);
      iVar8 = 10000;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        mbedtls_aes_crypt_ecb(&ctx,1,buf,buf);
      }
      pauVar3 = aes_test_ecb_enc;
    }
    pauVar3 = pauVar3 + uVar6;
    auVar11[0] = -((*pauVar3)[0] == buf[0]);
    auVar11[1] = -((*pauVar3)[1] == buf[1]);
    auVar11[2] = -((*pauVar3)[2] == buf[2]);
    auVar11[3] = -((*pauVar3)[3] == buf[3]);
    auVar11[4] = -((*pauVar3)[4] == buf[4]);
    auVar11[5] = -((*pauVar3)[5] == buf[5]);
    auVar11[6] = -((*pauVar3)[6] == buf[6]);
    auVar11[7] = -((*pauVar3)[7] == buf[7]);
    auVar11[8] = -((*pauVar3)[8] == buf[8]);
    auVar11[9] = -((*pauVar3)[9] == buf[9]);
    auVar11[10] = -((*pauVar3)[10] == buf[10]);
    auVar11[0xb] = -((*pauVar3)[0xb] == buf[0xb]);
    auVar11[0xc] = -((*pauVar3)[0xc] == buf[0xc]);
    auVar11[0xd] = -((*pauVar3)[0xd] == buf[0xd]);
    auVar11[0xe] = -((*pauVar3)[0xe] == buf[0xe]);
    auVar11[0xf] = -((*pauVar3)[0xf] == buf[0xf]);
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_0014dce0;
    if (verbose != 0) {
      puts("passed");
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  uVar9 = 0;
  while (uVar9 != 6) {
    uVar6 = uVar9 >> 1;
    local_214 = uVar9;
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar9 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)(uVar6 * 0x40 + 0x80),pcVar5);
    }
    iv[0] = '\0';
    iv[1] = '\0';
    iv[2] = '\0';
    iv[3] = '\0';
    iv[4] = '\0';
    iv[5] = '\0';
    iv[6] = '\0';
    iv[7] = '\0';
    iv[8] = '\0';
    iv[9] = '\0';
    iv[10] = '\0';
    iv[0xb] = '\0';
    iv[0xc] = '\0';
    iv[0xd] = '\0';
    iv[0xe] = '\0';
    iv[0xf] = '\0';
    prv[0] = '\0';
    prv[1] = '\0';
    prv[2] = '\0';
    prv[3] = '\0';
    prv[4] = '\0';
    prv[5] = '\0';
    prv[6] = '\0';
    prv[7] = '\0';
    prv[8] = '\0';
    prv[9] = '\0';
    prv[10] = '\0';
    prv[0xb] = '\0';
    prv[0xc] = '\0';
    prv[0xd] = '\0';
    prv[0xe] = '\0';
    prv[0xf] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    local_210 = (ulong)uVar6;
    uVar9 = uVar6 * 0x40 + 0x80;
    if ((local_214 & 1) == 0) {
      mbedtls_aes_setkey_dec(&ctx,key,uVar9);
      iVar8 = 10000;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        mbedtls_aes_crypt_cbc(&ctx,0,0x10,iv,buf,buf);
      }
      auVar12[0] = -(aes_test_cbc_dec[local_210][0] == buf[0]);
      auVar12[1] = -(aes_test_cbc_dec[local_210][1] == buf[1]);
      auVar12[2] = -(aes_test_cbc_dec[local_210][2] == buf[2]);
      auVar12[3] = -(aes_test_cbc_dec[local_210][3] == buf[3]);
      auVar12[4] = -(aes_test_cbc_dec[local_210][4] == buf[4]);
      auVar12[5] = -(aes_test_cbc_dec[local_210][5] == buf[5]);
      auVar12[6] = -(aes_test_cbc_dec[local_210][6] == buf[6]);
      auVar12[7] = -(aes_test_cbc_dec[local_210][7] == buf[7]);
      auVar12[8] = -(aes_test_cbc_dec[local_210][8] == buf[8]);
      auVar12[9] = -(aes_test_cbc_dec[local_210][9] == buf[9]);
      auVar12[10] = -(aes_test_cbc_dec[local_210][10] == buf[10]);
      auVar12[0xb] = -(aes_test_cbc_dec[local_210][0xb] == buf[0xb]);
      auVar12[0xc] = -(aes_test_cbc_dec[local_210][0xc] == buf[0xc]);
      auVar12[0xd] = -(aes_test_cbc_dec[local_210][0xd] == buf[0xd]);
      auVar12[0xe] = -(aes_test_cbc_dec[local_210][0xe] == buf[0xe]);
      auVar12[0xf] = -(aes_test_cbc_dec[local_210][0xf] == buf[0xf]);
    }
    else {
      mbedtls_aes_setkey_enc(&ctx,key,uVar9);
      iVar8 = 10000;
      while (auVar1 = prv, bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        mbedtls_aes_crypt_cbc(&ctx,1,0x10,iv,buf,buf);
        prv[0] = buf[0];
        prv[1] = buf[1];
        prv[2] = buf[2];
        prv[3] = buf[3];
        prv[4] = buf[4];
        prv[5] = buf[5];
        prv[6] = buf[6];
        prv[7] = buf[7];
        prv[8] = buf[8];
        prv[9] = buf[9];
        prv[10] = buf[10];
        prv[0xb] = buf[0xb];
        prv[0xc] = buf[0xc];
        prv[0xd] = buf[0xd];
        prv[0xe] = buf[0xe];
        prv[0xf] = buf[0xf];
        auVar2 = prv;
        prv[0] = auVar1[0];
        prv[1] = auVar1[1];
        prv[2] = auVar1[2];
        prv[3] = auVar1[3];
        prv[4] = auVar1[4];
        prv[5] = auVar1[5];
        prv[6] = auVar1[6];
        prv[7] = auVar1[7];
        prv[8] = auVar1[8];
        prv[9] = auVar1[9];
        prv[10] = auVar1[10];
        prv[0xb] = auVar1[0xb];
        prv[0xc] = auVar1[0xc];
        prv[0xd] = auVar1[0xd];
        prv[0xe] = auVar1[0xe];
        prv[0xf] = auVar1[0xf];
        buf[0] = prv[0];
        buf[1] = prv[1];
        buf[2] = prv[2];
        buf[3] = prv[3];
        buf[4] = prv[4];
        buf[5] = prv[5];
        buf[6] = prv[6];
        buf[7] = prv[7];
        buf[8] = prv[8];
        buf[9] = prv[9];
        buf[10] = prv[10];
        buf[0xb] = prv[0xb];
        buf[0xc] = prv[0xc];
        buf[0xd] = prv[0xd];
        buf[0xe] = prv[0xe];
        buf[0xf] = prv[0xf];
        prv = auVar2;
      }
      auVar12[0] = -(aes_test_cbc_enc[local_210][0] == prv[0]);
      auVar12[1] = -(aes_test_cbc_enc[local_210][1] == prv[1]);
      auVar12[2] = -(aes_test_cbc_enc[local_210][2] == prv[2]);
      auVar12[3] = -(aes_test_cbc_enc[local_210][3] == prv[3]);
      auVar12[4] = -(aes_test_cbc_enc[local_210][4] == prv[4]);
      auVar12[5] = -(aes_test_cbc_enc[local_210][5] == prv[5]);
      auVar12[6] = -(aes_test_cbc_enc[local_210][6] == prv[6]);
      auVar12[7] = -(aes_test_cbc_enc[local_210][7] == prv[7]);
      auVar12[8] = -(aes_test_cbc_enc[local_210][8] == prv[8]);
      auVar12[9] = -(aes_test_cbc_enc[local_210][9] == prv[9]);
      auVar12[10] = -(aes_test_cbc_enc[local_210][10] == prv[10]);
      auVar12[0xb] = -(aes_test_cbc_enc[local_210][0xb] == prv[0xb]);
      auVar12[0xc] = -(aes_test_cbc_enc[local_210][0xc] == prv[0xc]);
      auVar12[0xd] = -(aes_test_cbc_enc[local_210][0xd] == prv[0xd]);
      auVar12[0xe] = -(aes_test_cbc_enc[local_210][0xe] == prv[0xe]);
      auVar12[0xf] = -(aes_test_cbc_enc[local_210][0xf] == prv[0xf]);
    }
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0014dce0;
    if (verbose != 0) {
      puts("passed");
    }
    uVar9 = local_214 + 1;
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
    uVar7 = uVar9 >> 1;
    uVar6 = uVar7 * 0x40 + 0x80;
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar9 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)uVar6,pcVar5);
    }
    iv[8] = '\b';
    iv[9] = '\t';
    iv[10] = '\n';
    iv[0xb] = '\v';
    iv[0xc] = '\f';
    iv[0xd] = '\r';
    iv[0xe] = '\x0e';
    iv[0xf] = '\x0f';
    iv[0] = '\0';
    iv[1] = '\x01';
    iv[2] = '\x02';
    iv[3] = '\x03';
    iv[4] = '\x04';
    iv[5] = '\x05';
    iv[6] = '\x06';
    iv[7] = '\a';
    memcpy(key,aes_test_cfb128_key + uVar7,(ulong)(uVar7 * 8 + 0x10));
    offset = 0;
    mbedtls_aes_setkey_enc(&ctx,key,uVar6);
    if ((uVar9 & 1) == 0) {
      buf._0_16_ = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar7];
      buf._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x10);
      buf._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x18);
      buf._32_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x20);
      buf._40_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x28);
      buf._48_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x30);
      buf._56_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar7] + 0x38);
      mbedtls_aes_crypt_cfb128(&ctx,0,0x40,&offset,iv,buf,buf);
      __s2 = aes_test_cfb128_pt;
    }
    else {
      buf[0x30] = 0xf6;
      buf[0x31] = 0x9f;
      buf[0x32] = '$';
      buf[0x33] = 'E';
      buf[0x34] = 0xdf;
      buf[0x35] = 'O';
      buf[0x36] = 0x9b;
      buf[0x37] = '\x17';
      buf[0x38] = 0xad;
      buf[0x39] = '+';
      buf[0x3a] = 'A';
      buf[0x3b] = '{';
      buf[0x3c] = 0xe6;
      buf[0x3d] = 'l';
      buf[0x3e] = '7';
      buf[0x3f] = '\x10';
      buf[0x20] = '0';
      buf[0x21] = 200;
      buf[0x22] = '\x1c';
      buf[0x23] = 'F';
      buf[0x24] = 0xa3;
      buf[0x25] = '\\';
      buf[0x26] = 0xe4;
      buf[0x27] = '\x11';
      buf[0x28] = 0xe5;
      buf[0x29] = 0xfb;
      buf[0x2a] = 0xc1;
      buf[0x2b] = '\x19';
      buf[0x2c] = '\x1a';
      buf[0x2d] = '\n';
      buf[0x2e] = 'R';
      buf[0x2f] = 0xef;
      buf[0x10] = 0xae;
      buf[0x11] = '-';
      buf[0x12] = 0x8a;
      buf[0x13] = 'W';
      buf[0x14] = '\x1e';
      buf[0x15] = '\x03';
      buf[0x16] = 0xac;
      buf[0x17] = 0x9c;
      buf[0x18] = 0x9e;
      buf[0x19] = 0xb7;
      buf[0x1a] = 'o';
      buf[0x1b] = 0xac;
      buf[0x1c] = 'E';
      buf[0x1d] = 0xaf;
      buf[0x1e] = 0x8e;
      buf[0x1f] = 'Q';
      buf[8] = 0xe9;
      buf[9] = '=';
      buf[10] = '~';
      buf[0xb] = '\x11';
      buf[0xc] = 's';
      buf[0xd] = 0x93;
      buf[0xe] = '\x17';
      buf[0xf] = '*';
      buf[0] = 'k';
      buf[1] = 0xc1;
      buf[2] = 0xbe;
      buf[3] = 0xe2;
      buf[4] = '.';
      buf[5] = '@';
      buf[6] = 0x9f;
      buf[7] = 0x96;
      mbedtls_aes_crypt_cfb128(&ctx,1,0x40,&offset,iv,buf,buf);
      __s2 = aes_test_cfb128_ct[uVar7];
    }
    iVar8 = bcmp(buf,__s2,0x40);
    if (iVar8 != 0) goto LAB_0014dce0;
    if (verbose != 0) {
      puts("passed");
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
    if (verbose != 0) {
      pcVar5 = "enc";
      if ((uVar9 & 1) == 0) {
        pcVar5 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar5);
    }
    uVar6 = uVar9 >> 1;
    nonce_counter._0_8_ = *(undefined8 *)aes_test_ctr_nonce_counter[uVar6];
    nonce_counter._8_8_ = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar6] + 8);
    key._0_16_ = *(undefined1 (*) [16])(aes_test_ctr_key + uVar6);
    offset = 0;
    mbedtls_aes_setkey_enc(&ctx,key,0x80);
    __n = (size_t)aes_test_ctr_len[uVar6];
    if ((uVar9 & 1) == 0) {
      memcpy(buf,aes_test_ctr_ct + uVar6,__n);
      mbedtls_aes_crypt_ctr(&ctx,__n,&offset,nonce_counter,stream_block,buf,buf);
      pauVar4 = aes_test_ctr_pt;
    }
    else {
      memcpy(buf,aes_test_ctr_pt + uVar6,__n);
      mbedtls_aes_crypt_ctr(&ctx,__n,&offset,nonce_counter,stream_block,buf,buf);
      pauVar4 = aes_test_ctr_ct;
    }
    iVar8 = bcmp(buf,pauVar4 + uVar6,__n);
    if (iVar8 != 0) goto LAB_0014dce0;
    if (verbose != 0) {
      puts("passed");
    }
  }
  iVar8 = 0;
  if (verbose != 0) {
    putchar(10);
  }
LAB_0014dcf3:
  mbedtls_aes_free(&ctx);
  return iVar8;
LAB_0014dce0:
  iVar8 = 1;
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_0014dcf3;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char iv[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    int len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            mbedtls_aes_setkey_dec( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_ecb( &ctx, v, buf, buf );

            if( memcmp( buf, aes_test_ecb_dec[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_ecb( &ctx, v, buf, buf );

            if( memcmp( buf, aes_test_ecb_enc[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            mbedtls_aes_setkey_dec( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
                mbedtls_aes_crypt_cbc( &ctx, v, 16, iv, buf, buf );

            if( memcmp( buf, aes_test_cbc_dec[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

            for( j = 0; j < 10000; j++ )
            {
                unsigned char tmp[16];

                mbedtls_aes_crypt_cbc( &ctx, v, 16, iv, buf, buf );

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            if( memcmp( prv, aes_test_cbc_enc[u], 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], 16 + u * 8 );

        offset = 0;
        mbedtls_aes_setkey_enc( &ctx, key, 128 + u * 64 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            mbedtls_aes_crypt_cfb128( &ctx, v, 64, &offset, iv, buf, buf );

            if( memcmp( buf, aes_test_cfb128_pt, 64 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            mbedtls_aes_crypt_cfb128( &ctx, v, 64, &offset, iv, buf, buf );

            if( memcmp( buf, aes_test_cfb128_ct[u], 64 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                             ( v == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_aes_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_AES_DECRYPT )
        {
            len = aes_test_ctr_len[u];
            memcpy( buf, aes_test_ctr_ct[u], len );

            mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                           buf, buf );

            if( memcmp( buf, aes_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }
        else
        {
            len = aes_test_ctr_len[u];
            memcpy( buf, aes_test_ctr_pt[u], len );

            mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                           buf, buf );

            if( memcmp( buf, aes_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                ret = 1;
                goto exit;
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    ret = 0;

exit:
    mbedtls_aes_free( &ctx );

    return( ret );
}